

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::fix_up_shader_inputs_outputs(CompilerMSL *this)

{
  uint32_t uVar1;
  uint uVar2;
  BuiltIn BVar3;
  size_t sVar4;
  Variant *pVVar5;
  TypedID<(spirv_cross::Types)0> *pTVar6;
  bool bVar7;
  bool bVar8;
  ExecutionModel EVar9;
  StorageClass SVar10;
  SPIRFunction *pSVar11;
  SPIRVariable *pSVar12;
  _Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false> type;
  const_iterator cVar13;
  mapped_type *pmVar14;
  _Node_iterator_base<unsigned_int,_false> _Var15;
  SPIREntryPoint *pSVar16;
  runtime_error *this_00;
  long lVar17;
  char *pcVar18;
  LoopLock loop_lock;
  __hashtable *__h;
  undefined1 local_d0 [8];
  BuiltIn local_c8;
  uint32_t uStack_c4;
  _Manager_type local_c0;
  _Invoker_type local_b8;
  undefined8 uStack_b0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_a8;
  SPIRFunction *local_a0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_98;
  string local_90;
  ParsedIR *local_70;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  LoopLock local_40;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  pSVar11 = Variant::get<spirv_cross::SPIRFunction>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  EVar9 = Compiler::get_execution_model((Compiler *)this);
  if ((EVar9 == ExecutionModelVertex) && ((this->msl_options).vertex_for_tessellation == true)) {
    _local_c8 = (_Invoker_type *)0x0;
    local_b8 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14410:39)>
               ::_M_invoke;
    local_c0 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14410:39)>
               ::_M_manager;
    local_d0 = (undefined1  [8])this;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar11->fixup_hooks_in,(function<void_()> *)local_d0);
    if (local_c0 != (_Manager_type)0x0) {
      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
    }
  }
  EVar9 = Compiler::get_execution_model((Compiler *)this);
  if (EVar9 == ExecutionModelMeshEXT) {
    _local_c8 = 0;
    local_b8 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14421:39)>
               ::_M_invoke;
    local_c0 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14421:39)>
               ::_M_manager;
    local_d0 = (undefined1  [8])this;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar11->fixup_hooks_in,(function<void_()> *)local_d0);
    if (local_c0 != (_Manager_type)0x0) {
      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
    }
    _local_c8 = (_Invoker_type *)0x0;
    local_b8 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14422:40)>
               ::_M_invoke;
    local_c0 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14422:40)>
               ::_M_manager;
    local_d0 = (undefined1  [8])this;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar11->fixup_hooks_out,(function<void_()> *)local_d0);
    if (local_c0 != (_Manager_type)0x0) {
      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
    }
  }
  local_70 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_a0 = pSVar11;
  ParsedIR::create_loop_hard_lock(local_70);
  sVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar4 != 0) {
    local_68 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)(this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_98 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_a0->fixup_hooks_in;
    local_a8 = &(this->buffers_requiring_array_length)._M_h;
    local_38 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->recursive_inputs;
    lVar17 = 0;
    do {
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[*(uint *)(local_68 + lVar17)].type == TypeVariable) {
        pSVar12 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + *(uint *)(local_68 + lVar17));
        type._M_head_impl =
             (ObjectPoolGroup *)Compiler::get_variable_data_type((Compiler *)this,pSVar12);
        uVar1 = (pSVar12->super_IVariant).self.id;
        bVar7 = Compiler::has_decoration
                          ((Compiler *)this,
                           (ID)*(uint32_t *)
                                &(((unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                                    *)((long)(type._M_head_impl)->pools + 8))->_M_t).
                                 super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                           ,BufferBlock);
        SVar10 = pSVar12->storage;
        if (SVar10 == StorageClassUniformConstant) {
          bVar8 = Compiler::is_hidden_variable((Compiler *)this,pSVar12,false);
          if (bVar8) {
            SVar10 = pSVar12->storage;
            goto LAB_00213b6d;
          }
          if ((((this->msl_options).swizzle_texture_samples == true) &&
              (this->has_sampled_images == true)) &&
             (bVar7 = Compiler::is_sampled_image_type
                                ((Compiler *)this,(SPIRType *)type._M_head_impl), bVar7)) {
            _local_c8 = (_Invoker_type *)0x0;
            local_d0 = (undefined1  [8])operator_new(0x20);
            (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler._vptr_Compiler =
                 (_func_int **)this;
            (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
            super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
            ._M_t.
            super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
            .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl =
                 type._M_head_impl;
            (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.spirv.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pSVar12;
            *(uint32_t *)
             ((long)&(((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.spirv.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8) = uVar1;
            local_b8 = ::std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14435:41)>
                       ::_M_invoke;
            local_c0 = ::std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14435:41)>
                       ::_M_manager;
            SmallVector<std::function<void_()>,_0UL>::push_back
                      ((SmallVector<std::function<void_()>,_0UL> *)local_98,
                       (function<void_()> *)local_d0);
            if (local_c0 != (_Manager_type)0x0) {
              (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
            }
          }
        }
        else {
LAB_00213b6d:
          if (((SVar10 == StorageBuffer) || ((SVar10 == StorageClassUniform && (bVar7)))) &&
             (bVar7 = Compiler::is_hidden_variable((Compiler *)this,pSVar12,false), !bVar7)) {
            local_d0._0_4_ = (pSVar12->super_IVariant).self.id;
            cVar13 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(local_a8,(key_type *)local_d0);
            if (cVar13.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              _local_c8 = (_Invoker_type *)0x0;
              local_d0 = (undefined1  [8])operator_new(0x20);
              (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler._vptr_Compiler =
                   (_func_int **)this;
              (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
              super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
              ._M_t.
              super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
              .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl =
                   type._M_head_impl;
              (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.spirv.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)pSVar12;
              *(uint32_t *)
               ((long)&(((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.spirv.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8) = uVar1;
              local_b8 = ::std::
                         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14462:9)>
                         ::_M_invoke;
              local_c0 = ::std::
                         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14462:9)>
                         ::_M_manager;
              SmallVector<std::function<void_()>,_0UL>::push_back
                        ((SmallVector<std::function<void_()>,_0UL> *)local_98,
                         (function<void_()> *)local_d0);
              if (local_c0 != (_Manager_type)0x0) {
                (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
              }
            }
          }
        }
        if ((((this->msl_options).argument_buffers == false) &&
            ((this->msl_options).replace_recursive_inputs == true)) &&
           ((bVar7 = Compiler::type_contains_recursion
                               ((Compiler *)this,(SPIRType *)type._M_head_impl), bVar7 &&
            ((pSVar12->storage < (StorageBuffer|Input) &&
             ((0x1205U >> (pSVar12->storage & 0x1f) & 1) != 0)))))) {
          local_60._0_4_ =
               *(uint32_t *)
                &(((unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                    *)((long)(type._M_head_impl)->pools + 8))->_M_t).
                 super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
          ;
          local_d0 = (undefined1  [8])local_38;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    (local_38,&local_60,local_d0);
          _local_c8 = (_Invoker_type *)0x0;
          local_d0 = (undefined1  [8])operator_new(0x20);
          (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler._vptr_Compiler =
               (_func_int **)this;
          (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.pool_group._M_t.
          super___uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
          ._M_t.
          super__Tuple_impl<0UL,_spirv_cross::ObjectPoolGroup_*,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
          .super__Head_base<0UL,_spirv_cross::ObjectPoolGroup_*,_false>._M_head_impl =
               type._M_head_impl;
          (((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.spirv.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pSVar12;
          *(uint32_t *)
           ((long)&(((CompilerMSL *)local_d0)->super_CompilerGLSL).super_Compiler.ir.spirv.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data + 8) = uVar1;
          local_b8 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14491:40)>
                     ::_M_invoke;
          local_c0 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14491:40)>
                     ::_M_manager;
          SmallVector<std::function<void_()>,_0UL>::push_back
                    ((SmallVector<std::function<void_()>,_0UL> *)local_98,
                     (function<void_()> *)local_d0);
          if (local_c0 != (_Manager_type)0x0) {
            (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
          }
        }
      }
      lVar17 = lVar17 + 4;
    } while (sVar4 << 2 != lVar17);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_90);
  ParsedIR::create_loop_hard_lock(local_70);
  sVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar4 != 0) {
    pTVar6 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_68 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
    local_98 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h;
    local_a8 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&local_a0->fixup_hooks_in;
    local_a0 = (SPIRFunction *)&local_a0->fixup_hooks_out;
    local_70 = (ParsedIR *)&(this->super_CompilerGLSL).super_Compiler.active_output_builtins.higher;
    lVar17 = 0;
    do {
      uVar2 = *(uint *)((long)&pTVar6->id + lVar17);
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar2].type == TypeVariable) {
        pSVar12 = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar2);
        uVar1 = (pSVar12->super_IVariant).self.id;
        local_d0._0_4_ = uVar1;
        pmVar14 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_68,(key_type *)local_d0);
        if ((pSVar12->storage | StorageClassUniform) == Output) {
          BVar3 = (pmVar14->decoration).builtin_type;
          bVar7 = Compiler::interface_variable_exists_in_entry_point
                            ((Compiler *)this,(pSVar12->super_IVariant).self.id);
          if (bVar7) {
            SVar10 = pSVar12->storage;
            if (SVar10 == Input) {
              bVar7 = Compiler::is_builtin_variable((Compiler *)this,pSVar12);
              if (!bVar7) {
LAB_00213f86:
                SVar10 = pSVar12->storage;
                goto LAB_00213f8a;
              }
              local_d0._0_4_ = BVar3;
              if (BVar3 < 0x40) {
                _Var15._M_cur =
                     (__node_type *)
                     ((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >>
                      ((ulong)BVar3 & 0x3f) & 1);
              }
              else {
                _Var15._M_cur =
                     (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(local_98,(key_type *)local_d0);
              }
              if (_Var15._M_cur == (__node_type *)0x0) goto LAB_00213f86;
              if (0x113f < (int)BVar3) {
                switch(BVar3) {
                case BuiltInSubgroupEqMask:
                  uVar2 = (this->msl_options).msl_version;
                  if ((this->msl_options).platform == iOS) {
                    if (uVar2 < 0x4ee8) {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ::std::runtime_error::runtime_error
                                (this_00,"Subgroup ballot functionality requires Metal 2.2 on iOS.")
                      ;
                      goto LAB_0021527d;
                    }
                  }
                  else if (uVar2 < 0x4e84) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (this_00,"Subgroup ballot functionality requires Metal 2.1.");
LAB_0021527d:
                    *(undefined ***)this_00 = &PTR__runtime_error_0048ff00;
                    __cxa_throw(this_00,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  uStack_c4 = uVar1;
                  local_c8 = 0x1140;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14649:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14649:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                  break;
                case BuiltInSubgroupGeMask:
                  uVar2 = (this->msl_options).msl_version;
                  if ((this->msl_options).platform == iOS) {
                    if (uVar2 < 0x4ee8) {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ::std::runtime_error::runtime_error
                                (this_00,"Subgroup ballot functionality requires Metal 2.2 on iOS.")
                      ;
                      goto LAB_0021527d;
                    }
                  }
                  else if (uVar2 < 0x4e84) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (this_00,"Subgroup ballot functionality requires Metal 2.1.");
                    goto LAB_0021527d;
                  }
                  if ((this->msl_options).fixed_subgroup_size != 0) {
                    add_spv_func_and_recompile(this,SPVFuncImplSubgroupBallot);
                  }
                  uStack_c4 = uVar1;
                  local_c8 = 0x1141;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14671:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14671:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                  break;
                case BuiltInSubgroupGtMask:
                  uVar2 = (this->msl_options).msl_version;
                  if ((this->msl_options).platform == iOS) {
                    if (uVar2 < 0x4ee8) {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ::std::runtime_error::runtime_error
                                (this_00,"Subgroup ballot functionality requires Metal 2.2 on iOS.")
                      ;
                      goto LAB_0021527d;
                    }
                  }
                  else if (uVar2 < 0x4e84) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (this_00,"Subgroup ballot functionality requires Metal 2.1.");
                    goto LAB_0021527d;
                  }
                  add_spv_func_and_recompile(this,SPVFuncImplSubgroupBallot);
                  uStack_c4 = uVar1;
                  local_c8 = 0x1142;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14739:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14739:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                  break;
                case BuiltInSubgroupLeMask:
                  uVar2 = (this->msl_options).msl_version;
                  if ((this->msl_options).platform == iOS) {
                    if (uVar2 < 0x4ee8) {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ::std::runtime_error::runtime_error
                                (this_00,"Subgroup ballot functionality requires Metal 2.2 on iOS.")
                      ;
                      goto LAB_0021527d;
                    }
                  }
                  else if (uVar2 < 0x4e84) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (this_00,"Subgroup ballot functionality requires Metal 2.1.");
                    goto LAB_0021527d;
                  }
                  add_spv_func_and_recompile(this,SPVFuncImplSubgroupBallot);
                  uStack_c4 = uVar1;
                  local_c8 = 0x1143;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14791:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14791:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                  break;
                case BuiltInSubgroupLtMask:
                  uVar2 = (this->msl_options).msl_version;
                  if ((this->msl_options).platform == iOS) {
                    if (uVar2 < 0x4ee8) {
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ::std::runtime_error::runtime_error
                                (this_00,"Subgroup ballot functionality requires Metal 2.2 on iOS.")
                      ;
                      goto LAB_0021527d;
                    }
                  }
                  else if (uVar2 < 0x4e84) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (this_00,"Subgroup ballot functionality requires Metal 2.1.");
                    goto LAB_0021527d;
                  }
                  add_spv_func_and_recompile(this,SPVFuncImplSubgroupBallot);
                  uStack_c4 = uVar1;
                  local_c8 = 0x1144;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14814:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14814:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                  break;
                case BuiltInSubgroupLtMask|BuiltInPointSize:
                case 0x1146:
                case BuiltInSubgroupLtMask|BuiltInClipDistance:
                  break;
                case BaseVertex:
                  if ((this->msl_options).vertex_for_tessellation == true) {
                    uStack_c4 = uVar1;
                    local_c8 = 0x1148;
                    local_b8 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14960:41)>
                               ::_M_invoke;
                    local_c0 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14960:41)>
                               ::_M_manager;
                    local_d0 = (undefined1  [8])this;
                    SmallVector<std::function<void_()>,_0UL>::push_back
                              ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                               (function<void_()> *)local_d0);
                    if (local_c0 != (_Manager_type)0x0) {
                      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                    }
                  }
                  break;
                case BaseInstance:
                  if ((this->msl_options).vertex_for_tessellation == true) {
                    uStack_c4 = uVar1;
                    local_c8 = 0x1149;
                    local_b8 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14984:41)>
                               ::_M_invoke;
                    local_c0 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14984:41)>
                               ::_M_manager;
                    local_d0 = (undefined1  [8])this;
                    SmallVector<std::function<void_()>,_0UL>::push_back
                              ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                               (function<void_()> *)local_d0);
                    if (local_c0 != (_Manager_type)0x0) {
                      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                    }
                  }
                  break;
                default:
                  if (BVar3 == BuiltInDeviceIndex) {
                    uStack_c4 = uVar1;
                    local_c8 = 0x1156;
                    local_b8 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14896:41)>
                               ::_M_invoke;
                    local_c0 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14896:41)>
                               ::_M_manager;
                    local_d0 = (undefined1  [8])this;
                    SmallVector<std::function<void_()>,_0UL>::push_back
                              ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                               (function<void_()> *)local_d0);
                    if (local_c0 != (_Manager_type)0x0) {
                      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                    }
                  }
                  else if (BVar3 == BuiltInViewIndex) {
                    if ((this->msl_options).multiview == false) {
                      uStack_c4 = uVar1;
                      local_c8 = 0x1158;
                      local_b8 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14836:42)>
                                 ::_M_invoke;
                      local_c0 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14836:42)>
                                 ::_M_manager;
                      local_d0 = (undefined1  [8])this;
                      SmallVector<std::function<void_()>,_0UL>::push_back
                                ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                                 (function<void_()> *)local_d0);
                      if (local_c0 != (_Manager_type)0x0) {
                        (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                      }
                    }
                    else if ((this->msl_options).view_index_from_device_index == true) {
                      uStack_c4 = uVar1;
                      local_c8 = 0x1158;
                      local_b8 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14843:42)>
                                 ::_M_invoke;
                      local_c0 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14843:42)>
                                 ::_M_manager;
                      local_d0 = (undefined1  [8])this;
                      SmallVector<std::function<void_()>,_0UL>::push_back
                                ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                                 (function<void_()> *)local_d0);
                      if (local_c0 != (_Manager_type)0x0) {
                        (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                      }
                    }
                    else if ((this->msl_options).multiview_layered_rendering == false) {
                      uStack_c4 = uVar1;
                      local_c8 = 0x1158;
                      local_b8 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14855:42)>
                                 ::_M_invoke;
                      local_c0 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14855:42)>
                                 ::_M_manager;
                      local_d0 = (undefined1  [8])this;
                      SmallVector<std::function<void_()>,_0UL>::push_back
                                ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                                 (function<void_()> *)local_d0);
                      if (local_c0 != (_Manager_type)0x0) {
                        (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                      }
                    }
                    else {
                      EVar9 = Compiler::get_execution_model((Compiler *)this);
                      if (EVar9 == ExecutionModelFragment) {
                        uStack_c4 = 0;
                        local_c8 = uVar1;
                        local_b8 = ::std::
                                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14864:42)>
                                   ::_M_invoke;
                        local_c0 = ::std::
                                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14864:42)>
                                   ::_M_manager;
                        local_d0 = (undefined1  [8])this;
                        SmallVector<std::function<void_()>,_0UL>::push_back
                                  ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                                   (function<void_()> *)local_d0);
                        if (local_c0 != (_Manager_type)0x0) {
                          (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor)
                          ;
                        }
                      }
                      else {
                        EVar9 = Compiler::get_execution_model((Compiler *)this);
                        if (EVar9 == ExecutionModelVertex) {
                          uStack_c4 = uVar1;
                          local_c8 = 0x1158;
                          local_b8 = ::std::
                                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14872:42)>
                                     ::_M_invoke;
                          local_c0 = ::std::
                                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14872:42)>
                                     ::_M_manager;
                          local_d0 = (undefined1  [8])this;
                          SmallVector<std::function<void_()>,_0UL>::push_back
                                    ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                                     (function<void_()> *)local_d0);
                          if (local_c0 != (_Manager_type)0x0) {
                            (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,
                                        __destroy_functor);
                          }
                          uStack_c4 = 0;
                          local_c8 = uVar1;
                          local_b8 = ::std::
                                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14886:43)>
                                     ::_M_invoke;
                          local_c0 = ::std::
                                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14886:43)>
                                     ::_M_manager;
                          local_d0 = (undefined1  [8])this;
                          SmallVector<std::function<void_()>,_0UL>::push_back
                                    ((SmallVector<std::function<void_()>,_0UL> *)local_a0,
                                     (function<void_()> *)local_d0);
                          if (local_c0 != (_Manager_type)0x0) {
                            (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,
                                        __destroy_functor);
                          }
                        }
                      }
                    }
                  }
                }
                goto switchD_00213eff_caseD_9;
              }
              switch(BVar3) {
              case BuiltInVertexId:
              case BuiltInVertexIndex:
                if ((this->msl_options).vertex_for_tessellation == true) {
                  uStack_c4 = uVar1;
                  local_c8 = BVar3;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14936:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14936:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInInstanceId:
              case BuiltInInstanceIndex:
                if ((this->msl_options).vertex_for_tessellation == true) {
                  uStack_c4 = uVar1;
                  local_c8 = BVar3;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14971:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14971:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInPrimitiveId:
                EVar9 = Compiler::get_execution_model((Compiler *)this);
                if ((EVar9 == ExecutionModelTessellationControl) &&
                   ((this->msl_options).multi_patch_workgroup == true)) {
                  uStack_c4 = uVar1;
                  local_c8 = 7;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14546:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14546:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInInvocationId:
                EVar9 = Compiler::get_execution_model((Compiler *)this);
                if ((EVar9 == ExecutionModelTessellationControl) &&
                   ((this->msl_options).multi_patch_workgroup == true)) {
                  uStack_c4 = uVar1;
                  local_c8 = 8;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14534:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14534:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInTessCoord:
                pSVar16 = Compiler::get_entry_point((Compiler *)this);
                if (((pSVar16->flags).lower & 0x1000000) != 0) {
                  _local_c8 = (_Invoker_type *)0x0;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14585:42)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14585:42)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                if (((this->msl_options).tess_domain_origin_lower_left != true) ||
                   (bVar7 = Compiler::is_tessellating_triangles((Compiler *)this), bVar7)) break;
                CompilerGLSL::to_expression_abi_cxx11_
                          (&local_90,&this->super_CompilerGLSL,uVar1,true);
                _local_c8 = &local_b8;
                local_d0 = (undefined1  [8])this;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_c8,local_90._M_dataplus._M_p,
                           local_90._M_dataplus._M_p + local_90._M_string_length);
                local_60._8_8_ = 0;
                local_60._M_unused._M_object = operator_new(0x28);
                *(undefined1 (*) [8])local_60._M_unused._0_8_ = local_d0;
                *(code **)((long)local_60._M_unused._0_8_ + 8) =
                     (code *)((long)local_60._M_unused._0_8_ + 0x18);
                if ((_Invoker_type *)_local_c8 == &local_b8) {
                  *(_Invoker_type *)((long)local_60._M_unused._0_8_ + 0x18) = local_b8;
                  *(undefined8 *)((long)local_60._M_unused._0_8_ + 0x20) = uStack_b0;
                }
                else {
                  *(undefined8 *)((long)local_60._M_unused._0_8_ + 8) = _local_c8;
                  *(_Invoker_type *)((long)local_60._M_unused._0_8_ + 0x18) = local_b8;
                }
                *(_Manager_type *)((long)local_60._M_unused._0_8_ + 0x10) = local_c0;
                local_c0 = (_Manager_type)0x0;
                local_b8 = (_Invoker_type)((ulong)local_b8 & 0xffffffffffffff00);
                local_48 = ::std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14596:42)>
                           ::_M_invoke;
                local_50 = ::std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14596:42)>
                           ::_M_manager;
                _local_c8 = &local_b8;
                SmallVector<std::function<void_()>,_0UL>::push_back
                          ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                           (function<void_()> *)&local_60);
                if (local_50 != (code *)0x0) {
                  (*local_50)(&local_60,&local_60,__destroy_functor);
                }
LAB_00214b0c:
                if ((_Invoker_type *)_local_c8 != &local_b8) {
                  operator_delete((void *)_local_c8);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p);
                }
                break;
              case BuiltInPatchVertices:
                EVar9 = Compiler::get_execution_model((Compiler *)this);
                if (EVar9 == ExecutionModelTessellationEvaluation) {
                  if ((this->msl_options).raw_buffer_tese_input == true) {
                    uStack_c4 = uVar1;
                    local_c8 = 0xe;
                    local_b8 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14558:11)>
                               ::_M_invoke;
                    local_c0 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14558:11)>
                               ::_M_manager;
                    local_d0 = (undefined1  [8])this;
                    SmallVector<std::function<void_()>,_0UL>::push_back
                              ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                               (function<void_()> *)local_d0);
                    if (local_c0 != (_Manager_type)0x0) {
                      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                    }
                  }
                  else {
                    uStack_c4 = uVar1;
                    local_c8 = 0xe;
                    local_b8 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14566:11)>
                               ::_M_invoke;
                    local_c0 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14566:11)>
                               ::_M_manager;
                    local_d0 = (undefined1  [8])this;
                    SmallVector<std::function<void_()>,_0UL>::push_back
                              ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                               (function<void_()> *)local_d0);
                    if (local_c0 != (_Manager_type)0x0) {
                      (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                    }
                  }
                }
                else {
                  uStack_c4 = uVar1;
                  local_c8 = 0xe;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14575:42)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14575:42)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInFragCoord:
                bVar7 = is_sample_rate(this);
                if (bVar7) {
                  uStack_c4 = 0;
                  local_c8 = uVar1;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14523:42)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14523:42)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInSamplePosition:
                uStack_c4 = uVar1;
                local_c8 = 0x13;
                local_b8 = ::std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14515:41)>
                           ::_M_invoke;
                local_c0 = ::std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14515:41)>
                           ::_M_manager;
                local_d0 = (undefined1  [8])this;
                SmallVector<std::function<void_()>,_0UL>::push_back
                          ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                           (function<void_()> *)local_d0);
                if (local_c0 != (_Manager_type)0x0) {
                  (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                }
                break;
              case BuiltInWorkgroupId:
                if (((this->msl_options).dispatch_base == true) &&
                   (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower &
                    0x4000000) != 0)) {
                  uStack_c4 = 0;
                  local_c8 = uVar1;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14908:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14908:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInGlobalInvocationId:
                if (((this->msl_options).dispatch_base == true) &&
                   (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower &
                    0x10000000) != 0)) {
                  uStack_c4 = 0;
                  local_c8 = uVar1;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14918:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14918:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInSubgroupSize:
                if ((this->msl_options).emulate_subgroups == true) {
                  uStack_c4 = uVar1;
                  local_c8 = 0x24;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14634:10)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14634:10)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                else if ((this->msl_options).fixed_subgroup_size != 0) {
                  uStack_c4 = uVar1;
                  local_c8 = 0x24;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14638:42)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14638:42)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInNumSubgroups:
                if ((this->msl_options).emulate_subgroups == true) {
                  uStack_c4 = uVar1;
                  local_c8 = 0x26;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14612:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14612:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInSubgroupId:
                if ((this->msl_options).emulate_subgroups == true) {
                  uStack_c4 = uVar1;
                  local_c8 = 0x28;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14603:41)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14603:41)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
                break;
              case BuiltInSubgroupLocalInvocationId:
                if ((this->msl_options).emulate_subgroups == true) {
                  uStack_c4 = uVar1;
                  local_c8 = 0x29;
                  local_b8 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14627:9)>
                             ::_M_invoke;
                  local_c0 = ::std::
                             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:14627:9)>
                             ::_M_manager;
                  local_d0 = (undefined1  [8])this;
                  SmallVector<std::function<void_()>,_0UL>::push_back
                            ((SmallVector<std::function<void_()>,_0UL> *)local_a8,
                             (function<void_()> *)local_d0);
                  if (local_c0 != (_Manager_type)0x0) {
                    (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                  }
                }
              }
            }
            else {
LAB_00213f8a:
              if (((SVar10 == Output) &&
                  (EVar9 = Compiler::get_execution_model((Compiler *)this),
                  EVar9 == ExecutionModelFragment)) &&
                 (bVar7 = Compiler::is_builtin_variable((Compiler *)this,pSVar12), bVar7)) {
                local_d0._0_4_ = BVar3;
                if (BVar3 < 0x40) {
                  _Var15._M_cur =
                       (__node_type *)
                       ((this->super_CompilerGLSL).super_Compiler.active_output_builtins.lower >>
                        ((ulong)BVar3 & 0x3f) & 1);
                }
                else {
                  _Var15._M_cur =
                       (__node_type *)
                       ::std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               *)local_70,(key_type *)local_d0);
                }
                if (_Var15._M_cur != (__node_type *)0x0) {
                  if (BVar3 == BuiltInFragDepth) {
                    if (((this->msl_options).input_attachment_is_ds_attachment == true) &&
                       (this->writes_to_depth == false)) {
                      _local_c8 = (_Invoker_type *)0x0;
                      local_b8 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:15013:43)>
                                 ::_M_invoke;
                      local_c0 = ::std::
                                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:15013:43)>
                                 ::_M_manager;
                      local_d0 = (undefined1  [8])this;
                      SmallVector<std::function<void_()>,_0UL>::push_back
                                ((SmallVector<std::function<void_()>,_0UL> *)local_a0,
                                 (function<void_()> *)local_d0);
                      if (local_c0 != (_Manager_type)0x0) {
                        (*local_c0)((_Any_data *)local_d0,(_Any_data *)local_d0,__destroy_functor);
                      }
                    }
                  }
                  else if ((BVar3 == BuiltInSampleMask) &&
                          ((this->msl_options).additional_fixed_sample_mask != 0xffffffff)) {
                    pcVar18 = " = ";
                    if ((ulong)this->does_shader_write_sample_mask != 0) {
                      pcVar18 = " &= ";
                    }
                    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_90,pcVar18,
                               pcVar18 + (ulong)this->does_shader_write_sample_mask + 3);
                    _local_c8 = &local_b8;
                    local_d0 = (undefined1  [8])this;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_c8,local_90._M_dataplus._M_p,
                               local_90._M_dataplus._M_p + local_90._M_string_length);
                    local_60._8_8_ = 0;
                    local_60._M_unused._M_object = operator_new(0x28);
                    *(undefined1 (*) [8])local_60._M_unused._0_8_ = local_d0;
                    *(code **)((long)local_60._M_unused._0_8_ + 8) =
                         (code *)((long)local_60._M_unused._0_8_ + 0x18);
                    if ((_Invoker_type *)_local_c8 == &local_b8) {
                      *(_Invoker_type *)((long)local_60._M_unused._0_8_ + 0x18) = local_b8;
                      *(undefined8 *)((long)local_60._M_unused._0_8_ + 0x20) = uStack_b0;
                    }
                    else {
                      *(undefined8 *)((long)local_60._M_unused._0_8_ + 8) = _local_c8;
                      *(_Invoker_type *)((long)local_60._M_unused._0_8_ + 0x18) = local_b8;
                    }
                    *(_Manager_type *)((long)local_60._M_unused._0_8_ + 0x10) = local_c0;
                    local_c0 = (_Manager_type)0x0;
                    local_b8 = (_Invoker_type)((ulong)local_b8 & 0xffffffffffffff00);
                    local_48 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:15005:43)>
                               ::_M_invoke;
                    local_50 = ::std::
                               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:15005:43)>
                               ::_M_manager;
                    _local_c8 = &local_b8;
                    SmallVector<std::function<void_()>,_0UL>::push_back
                              ((SmallVector<std::function<void_()>,_0UL> *)local_a0,
                               (function<void_()> *)&local_60);
                    if (local_50 != (code *)0x0) {
                      (*local_50)(&local_60,&local_60,__destroy_functor);
                    }
                    goto LAB_00214b0c;
                  }
                }
              }
            }
          }
        }
      }
switchD_00213eff_caseD_9:
      lVar17 = lVar17 + 4;
    } while (sVar4 << 2 != lVar17);
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return;
}

Assistant:

void CompilerMSL::fix_up_shader_inputs_outputs()
{
	auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);

	// Emit a guard to ensure we don't execute beyond the last vertex.
	// Vertex shaders shouldn't have the problems with barriers in non-uniform control flow that
	// tessellation control shaders do, so early returns should be OK. We may need to revisit this
	// if it ever becomes possible to use barriers from a vertex shader.
	if (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation)
	{
		entry_func.fixup_hooks_in.push_back([this]() {
			statement("if (any(", to_expression(builtin_invocation_id_id),
			          " >= ", to_expression(builtin_stage_input_size_id), "))");
			statement("    return;");
		});
	}

	if (is_mesh_shader())
	{
		// If shader doesn't call SetMeshOutputsEXT, nothing should be rendered.
		// No need to barrier after this, because only thread 0 writes to this later.
		entry_func.fixup_hooks_in.push_back([this]() { statement("if (gl_LocalInvocationIndex == 0) spvMeshSizes.y = 0u;"); });
		entry_func.fixup_hooks_out.push_back([this]() { emit_mesh_outputs(); });
	}

	// Look for sampled images and buffer. Add hooks to set up the swizzle constants or array lengths.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = get_variable_data_type(var);
		uint32_t var_id = var.self;
		bool ssbo = has_decoration(type.self, DecorationBufferBlock);

		if (var.storage == StorageClassUniformConstant && !is_hidden_variable(var))
		{
			if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			{
				entry_func.fixup_hooks_in.push_back([this, &type, &var, var_id]() {
					bool is_array_type = !type.array.empty();

					uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
					if (descriptor_set_is_argument_buffer(desc_set))
					{
						statement("constant uint", is_array_type ? "* " : "& ", to_swizzle_expression(var_id),
						          is_array_type ? " = &" : " = ", to_name(argument_buffer_ids[desc_set]),
						          ".spvSwizzleConstants", "[",
						          convert_to_string(get_metal_resource_index(var, SPIRType::Image)), "];");
					}
					else
					{
						// If we have an array of images, we need to be able to index into it, so take a pointer instead.
						statement("constant uint", is_array_type ? "* " : "& ", to_swizzle_expression(var_id),
						          is_array_type ? " = &" : " = ", to_name(swizzle_buffer_id), "[",
						          convert_to_string(get_metal_resource_index(var, SPIRType::Image)), "];");
					}
				});
			}
		}
		else if ((var.storage == StorageClassStorageBuffer || (var.storage == StorageClassUniform && ssbo)) &&
		         !is_hidden_variable(var))
		{
			if (buffer_requires_array_length(var.self))
			{
				entry_func.fixup_hooks_in.push_back(
				    [this, &type, &var, var_id]()
				    {
					    bool is_array_type = !type.array.empty() && !is_var_runtime_size_array(var);

					    uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
					    if (descriptor_set_is_argument_buffer(desc_set))
					    {
						    statement("constant uint", is_array_type ? "* " : "& ", to_buffer_size_expression(var_id),
						              is_array_type ? " = &" : " = ", to_name(argument_buffer_ids[desc_set]),
						              ".spvBufferSizeConstants", "[",
						              convert_to_string(get_metal_resource_index(var, SPIRType::UInt)), "];");
					    }
					    else
					    {
						    // If we have an array of images, we need to be able to index into it, so take a pointer instead.
						    statement("constant uint", is_array_type ? "* " : "& ", to_buffer_size_expression(var_id),
						              is_array_type ? " = &" : " = ", to_name(buffer_size_buffer_id), "[",
						              convert_to_string(get_metal_resource_index(var, type.basetype)), "];");
					    }
				    });
			}
		}

		if (!msl_options.argument_buffers &&
		     msl_options.replace_recursive_inputs && type_contains_recursion(type) &&
		    (var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer))
		{
			recursive_inputs.insert(type.self);
			entry_func.fixup_hooks_in.push_back([this, &type, &var, var_id]() {
				auto addr_space = get_argument_address_space(var);
				auto var_name = to_name(var_id);
				statement(addr_space, " auto& ", to_restrict(var_id, true), var_name,
				          " = *(", addr_space, " ", type_to_glsl(type), "*)", var_name, "_vp;");
			});
		}
	});

	// Builtin variables
	ir.for_each_typed_id<SPIRVariable>([this, &entry_func](uint32_t, SPIRVariable &var) {
		uint32_t var_id = var.self;
		BuiltIn bi_type = ir.meta[var_id].decoration.builtin_type;

		if (var.storage != StorageClassInput && var.storage != StorageClassOutput)
			return;
		if (!interface_variable_exists_in_entry_point(var.self))
			return;

		if (var.storage == StorageClassInput && is_builtin_variable(var) && active_input_builtins.get(bi_type))
		{
			switch (bi_type)
			{
			case BuiltInSamplePosition:
				entry_func.fixup_hooks_in.push_back([=]() {
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = get_sample_position(",
					          to_expression(builtin_sample_id_id), ");");
				});
				break;
			case BuiltInFragCoord:
				if (is_sample_rate())
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(to_expression(var_id), ".xy += get_sample_position(",
						          to_expression(builtin_sample_id_id), ") - 0.5;");
					});
				}
				break;
			case BuiltInInvocationId:
				// This is direct-mapped without multi-patch workgroups.
				if (!is_tesc_shader() || !msl_options.multi_patch_workgroup)
					break;

				entry_func.fixup_hooks_in.push_back([=]() {
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
					          to_expression(builtin_invocation_id_id), ".x % ", this->get_entry_point().output_vertices,
					          ";");
				});
				break;
			case BuiltInPrimitiveId:
				// This is natively supported by fragment and tessellation evaluation shaders.
				// In tessellation control shaders, this is direct-mapped without multi-patch workgroups.
				if (!is_tesc_shader() || !msl_options.multi_patch_workgroup)
					break;

				entry_func.fixup_hooks_in.push_back([=]() {
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = min(",
					          to_expression(builtin_invocation_id_id), ".x / ", this->get_entry_point().output_vertices,
					          ", spvIndirectParams[1] - 1);");
				});
				break;
			case BuiltInPatchVertices:
				if (is_tese_shader())
				{
					if (msl_options.raw_buffer_tese_input)
					{
						entry_func.fixup_hooks_in.push_back(
						    [=]() {
							    statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
							              get_entry_point().output_vertices, ";");
						    });
					}
					else
					{
						entry_func.fixup_hooks_in.push_back(
						    [=]()
						    {
							    statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
							              to_expression(patch_stage_in_var_id), ".gl_in.size();");
						    });
					}
				}
				else
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = spvIndirectParams[0];");
					});
				}
				break;
			case BuiltInTessCoord:
				if (get_entry_point().flags.get(ExecutionModeQuads))
				{
					// The entry point will only have a float2 TessCoord variable.
					// Pad to float3.
					entry_func.fixup_hooks_in.push_back([=]() {
						auto name = builtin_to_glsl(BuiltInTessCoord, StorageClassInput);
						statement("float3 " + name + " = float3(" + name + "In.x, " + name + "In.y, 0.0);");
					});
				}

				// Emit a fixup to account for the shifted domain. Don't do this for triangles;
				// MoltenVK will just reverse the winding order instead.
				if (msl_options.tess_domain_origin_lower_left && !is_tessellating_triangles())
				{
					string tc = to_expression(var_id);
					entry_func.fixup_hooks_in.push_back([=]() { statement(tc, ".y = 1.0 - ", tc, ".y;"); });
				}
				break;
			case BuiltInSubgroupId:
				if (!msl_options.emulate_subgroups)
					break;
				// For subgroup emulation, this is the same as the local invocation index.
				entry_func.fixup_hooks_in.push_back([=]() {
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
					          to_expression(builtin_local_invocation_index_id), ";");
				});
				break;
			case BuiltInNumSubgroups:
				if (!msl_options.emulate_subgroups)
					break;
				// For subgroup emulation, this is the same as the workgroup size.
				entry_func.fixup_hooks_in.push_back([=]() {
					auto &type = expression_type(builtin_workgroup_size_id);
					string size_expr = to_expression(builtin_workgroup_size_id);
					if (type.vecsize >= 3)
						size_expr = join(size_expr, ".x * ", size_expr, ".y * ", size_expr, ".z");
					else if (type.vecsize == 2)
						size_expr = join(size_expr, ".x * ", size_expr, ".y");
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ", size_expr, ";");
				});
				break;
			case BuiltInSubgroupLocalInvocationId:
				if (!msl_options.emulate_subgroups)
					break;
				// For subgroup emulation, assume subgroups of size 1.
				entry_func.fixup_hooks_in.push_back(
				    [=]() { statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = 0;"); });
				break;
			case BuiltInSubgroupSize:
				if (msl_options.emulate_subgroups)
				{
					// For subgroup emulation, assume subgroups of size 1.
					entry_func.fixup_hooks_in.push_back(
					    [=]() { statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = 1;"); });
				}
				else if (msl_options.fixed_subgroup_size != 0)
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
						          msl_options.fixed_subgroup_size, ";");
					});
				}
				break;
			case BuiltInSubgroupEqMask:
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 2))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.2 on iOS.");
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.1.");
				entry_func.fixup_hooks_in.push_back([=]() {
					if (msl_options.is_ios())
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ", "uint4(1 << ",
						          to_expression(builtin_subgroup_invocation_id_id), ", uint3(0));");
					}
					else
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
						          to_expression(builtin_subgroup_invocation_id_id), " >= 32 ? uint4(0, (1 << (",
						          to_expression(builtin_subgroup_invocation_id_id), " - 32)), uint2(0)) : uint4(1 << ",
						          to_expression(builtin_subgroup_invocation_id_id), ", uint3(0));");
					}
				});
				break;
			case BuiltInSubgroupGeMask:
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 2))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.2 on iOS.");
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.1.");
				if (msl_options.fixed_subgroup_size != 0)
					add_spv_func_and_recompile(SPVFuncImplSubgroupBallot);
				entry_func.fixup_hooks_in.push_back([=]() {
					// Case where index < 32, size < 32:
					// mask0 = bfi(0, 0xFFFFFFFF, index, size - index);
					// mask1 = bfi(0, 0xFFFFFFFF, 0, 0); // Gives 0
					// Case where index < 32 but size >= 32:
					// mask0 = bfi(0, 0xFFFFFFFF, index, 32 - index);
					// mask1 = bfi(0, 0xFFFFFFFF, 0, size - 32);
					// Case where index >= 32:
					// mask0 = bfi(0, 0xFFFFFFFF, 32, 0); // Gives 0
					// mask1 = bfi(0, 0xFFFFFFFF, index - 32, size - index);
					// This is expressed without branches to avoid divergent
					// control flow--hence the complicated min/max expressions.
					// This is further complicated by the fact that if you attempt
					// to bfi/bfe out-of-bounds on Metal, undefined behavior is the
					// result.
					if (msl_options.fixed_subgroup_size > 32)
					{
						// Don't use the subgroup size variable with fixed subgroup sizes,
						// since the variables could be defined in the wrong order.
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, min(",
						          to_expression(builtin_subgroup_invocation_id_id), ", 32u), (uint)max(32 - (int)",
						          to_expression(builtin_subgroup_invocation_id_id),
						          ", 0)), insert_bits(0u, 0xFFFFFFFF,"
						          " (uint)max((int)",
						          to_expression(builtin_subgroup_invocation_id_id), " - 32, 0), ",
						          msl_options.fixed_subgroup_size, " - max(",
						          to_expression(builtin_subgroup_invocation_id_id),
						          ", 32u)), uint2(0));");
					}
					else if (msl_options.fixed_subgroup_size != 0)
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, ",
						          to_expression(builtin_subgroup_invocation_id_id), ", ",
						          msl_options.fixed_subgroup_size, " - ",
						          to_expression(builtin_subgroup_invocation_id_id),
						          "), uint3(0));");
					}
					else if (msl_options.is_ios())
					{
						// On iOS, the SIMD-group size will currently never exceed 32.
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, ",
						          to_expression(builtin_subgroup_invocation_id_id), ", ",
						          to_expression(builtin_subgroup_size_id), " - ",
						          to_expression(builtin_subgroup_invocation_id_id), "), uint3(0));");
					}
					else
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, min(",
						          to_expression(builtin_subgroup_invocation_id_id), ", 32u), (uint)max(min((int)",
						          to_expression(builtin_subgroup_size_id), ", 32) - (int)",
						          to_expression(builtin_subgroup_invocation_id_id),
						          ", 0)), insert_bits(0u, 0xFFFFFFFF, (uint)max((int)",
						          to_expression(builtin_subgroup_invocation_id_id), " - 32, 0), (uint)max((int)",
						          to_expression(builtin_subgroup_size_id), " - (int)max(",
						          to_expression(builtin_subgroup_invocation_id_id), ", 32u), 0)), uint2(0));");
					}
				});
				break;
			case BuiltInSubgroupGtMask:
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 2))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.2 on iOS.");
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.1.");
				add_spv_func_and_recompile(SPVFuncImplSubgroupBallot);
				entry_func.fixup_hooks_in.push_back([=]() {
					// The same logic applies here, except now the index is one
					// more than the subgroup invocation ID.
					if (msl_options.fixed_subgroup_size > 32)
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, min(",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1, 32u), (uint)max(32 - (int)",
						          to_expression(builtin_subgroup_invocation_id_id),
						          " - 1, 0)), insert_bits(0u, 0xFFFFFFFF, (uint)max((int)",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1 - 32, 0), ",
						          msl_options.fixed_subgroup_size, " - max(",
						          to_expression(builtin_subgroup_invocation_id_id),
						          " + 1, 32u)), uint2(0));");
					}
					else if (msl_options.fixed_subgroup_size != 0)
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, ",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1, ",
						          msl_options.fixed_subgroup_size, " - ",
						          to_expression(builtin_subgroup_invocation_id_id),
						          " - 1), uint3(0));");
					}
					else if (msl_options.is_ios())
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, ",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1, ",
						          to_expression(builtin_subgroup_size_id), " - ",
						          to_expression(builtin_subgroup_invocation_id_id), " - 1), uint3(0));");
					}
					else
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(insert_bits(0u, 0xFFFFFFFF, min(",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1, 32u), (uint)max(min((int)",
						          to_expression(builtin_subgroup_size_id), ", 32) - (int)",
						          to_expression(builtin_subgroup_invocation_id_id),
						          " - 1, 0)), insert_bits(0u, 0xFFFFFFFF, (uint)max((int)",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1 - 32, 0), (uint)max((int)",
						          to_expression(builtin_subgroup_size_id), " - (int)max(",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1, 32u), 0)), uint2(0));");
					}
				});
				break;
			case BuiltInSubgroupLeMask:
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 2))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.2 on iOS.");
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.1.");
				add_spv_func_and_recompile(SPVFuncImplSubgroupBallot);
				entry_func.fixup_hooks_in.push_back([=]() {
					if (msl_options.is_ios())
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(extract_bits(0xFFFFFFFF, 0, ",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1), uint3(0));");
					}
					else
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(extract_bits(0xFFFFFFFF, 0, min(",
						          to_expression(builtin_subgroup_invocation_id_id),
						          " + 1, 32u)), extract_bits(0xFFFFFFFF, 0, (uint)max((int)",
						          to_expression(builtin_subgroup_invocation_id_id), " + 1 - 32, 0)), uint2(0));");
					}
				});
				break;
			case BuiltInSubgroupLtMask:
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 2))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.2 on iOS.");
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Subgroup ballot functionality requires Metal 2.1.");
				add_spv_func_and_recompile(SPVFuncImplSubgroupBallot);
				entry_func.fixup_hooks_in.push_back([=]() {
					if (msl_options.is_ios())
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(extract_bits(0xFFFFFFFF, 0, ",
						          to_expression(builtin_subgroup_invocation_id_id), "), uint3(0));");
					}
					else
					{
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id),
						          " = uint4(extract_bits(0xFFFFFFFF, 0, min(",
						          to_expression(builtin_subgroup_invocation_id_id),
						          ", 32u)), extract_bits(0xFFFFFFFF, 0, (uint)max((int)",
						          to_expression(builtin_subgroup_invocation_id_id), " - 32, 0)), uint2(0));");
					}
				});
				break;
			case BuiltInViewIndex:
				if (!msl_options.multiview)
				{
					// According to the Vulkan spec, when not running under a multiview
					// render pass, ViewIndex is 0.
					entry_func.fixup_hooks_in.push_back([=]() {
						statement("const ", builtin_type_decl(bi_type), " ", to_expression(var_id), " = 0;");
					});
				}
				else if (msl_options.view_index_from_device_index)
				{
					// In this case, we take the view index from that of the device we're running on.
					entry_func.fixup_hooks_in.push_back([=]() {
						statement("const ", builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
						          msl_options.device_index, ";");
					});
					// We actually don't want to set the render_target_array_index here.
					// Since every physical device is rendering a different view,
					// there's no need for layered rendering here.
				}
				else if (!msl_options.multiview_layered_rendering)
				{
					// In this case, the views are rendered one at a time. The view index, then,
					// is just the first part of the "view mask".
					entry_func.fixup_hooks_in.push_back([=]() {
						statement("const ", builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
						          to_expression(view_mask_buffer_id), "[0];");
					});
				}
				else if (get_execution_model() == ExecutionModelFragment)
				{
					// Because we adjusted the view index in the vertex shader, we have to
					// adjust it back here.
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(to_expression(var_id), " += ", to_expression(view_mask_buffer_id), "[0];");
					});
				}
				else if (get_execution_model() == ExecutionModelVertex)
				{
					// Metal provides no special support for multiview, so we smuggle
					// the view index in the instance index.
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
						          to_expression(view_mask_buffer_id), "[0] + (", to_expression(builtin_instance_idx_id),
						          " - ", to_expression(builtin_base_instance_id), ") % ",
						          to_expression(view_mask_buffer_id), "[1];");
						statement(to_expression(builtin_instance_idx_id), " = (",
						          to_expression(builtin_instance_idx_id), " - ",
						          to_expression(builtin_base_instance_id), ") / ", to_expression(view_mask_buffer_id),
						          "[1] + ", to_expression(builtin_base_instance_id), ";");
					});
					// In addition to setting the variable itself, we also need to
					// set the render_target_array_index with it on output. We have to
					// offset this by the base view index, because Metal isn't in on
					// our little game here.
					entry_func.fixup_hooks_out.push_back([=]() {
						statement(to_expression(builtin_layer_id), " = ", to_expression(var_id), " - ",
						          to_expression(view_mask_buffer_id), "[0];");
					});
				}
				break;
			case BuiltInDeviceIndex:
				// Metal pipelines belong to the devices which create them, so we'll
				// need to create a MTLPipelineState for every MTLDevice in a grouped
				// VkDevice. We can assume, then, that the device index is constant.
				entry_func.fixup_hooks_in.push_back([=]() {
					statement("const ", builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
					          msl_options.device_index, ";");
				});
				break;
			case BuiltInWorkgroupId:
				if (!msl_options.dispatch_base || !active_input_builtins.get(BuiltInWorkgroupId))
					break;

				// The vkCmdDispatchBase() command lets the client set the base value
				// of WorkgroupId. Metal has no direct equivalent; we must make this
				// adjustment ourselves.
				entry_func.fixup_hooks_in.push_back([=]() {
					statement(to_expression(var_id), " += ", to_dereferenced_expression(builtin_dispatch_base_id), ";");
				});
				break;
			case BuiltInGlobalInvocationId:
				if (!msl_options.dispatch_base || !active_input_builtins.get(BuiltInGlobalInvocationId))
					break;

				// GlobalInvocationId is defined as LocalInvocationId + WorkgroupId * WorkgroupSize.
				// This needs to be adjusted too.
				entry_func.fixup_hooks_in.push_back([=]() {
					auto &execution = this->get_entry_point();
					uint32_t workgroup_size_id = execution.workgroup_size.constant;
					if (workgroup_size_id)
						statement(to_expression(var_id), " += ", to_dereferenced_expression(builtin_dispatch_base_id),
						          " * ", to_expression(workgroup_size_id), ";");
					else
						statement(to_expression(var_id), " += ", to_dereferenced_expression(builtin_dispatch_base_id),
						          " * uint3(", execution.workgroup_size.x, ", ", execution.workgroup_size.y, ", ",
						          execution.workgroup_size.z, ");");
				});
				break;
			case BuiltInVertexId:
			case BuiltInVertexIndex:
				// This is direct-mapped normally.
				if (!msl_options.vertex_for_tessellation)
					break;

				entry_func.fixup_hooks_in.push_back([=]() {
					builtin_declaration = true;
					switch (msl_options.vertex_index_type)
					{
					case Options::IndexType::None:
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
						          to_expression(builtin_invocation_id_id), ".x + ",
						          to_expression(builtin_dispatch_base_id), ".x;");
						break;
					case Options::IndexType::UInt16:
					case Options::IndexType::UInt32:
						statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ", index_buffer_var_name,
						          "[", to_expression(builtin_invocation_id_id), ".x] + ",
						          to_expression(builtin_dispatch_base_id), ".x;");
						break;
					}
					builtin_declaration = false;
				});
				break;
			case BuiltInBaseVertex:
				// This is direct-mapped normally.
				if (!msl_options.vertex_for_tessellation)
					break;

				entry_func.fixup_hooks_in.push_back([=]() {
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
					          to_expression(builtin_dispatch_base_id), ".x;");
				});
				break;
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
				// This is direct-mapped normally.
				if (!msl_options.vertex_for_tessellation)
					break;

				entry_func.fixup_hooks_in.push_back([=]() {
					builtin_declaration = true;
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
					          to_expression(builtin_invocation_id_id), ".y + ", to_expression(builtin_dispatch_base_id),
					          ".y;");
					builtin_declaration = false;
				});
				break;
			case BuiltInBaseInstance:
				// This is direct-mapped normally.
				if (!msl_options.vertex_for_tessellation)
					break;

				entry_func.fixup_hooks_in.push_back([=]() {
					statement(builtin_type_decl(bi_type), " ", to_expression(var_id), " = ",
					          to_expression(builtin_dispatch_base_id), ".y;");
				});
				break;
			default:
				break;
			}
		}
		else if (var.storage == StorageClassOutput && get_execution_model() == ExecutionModelFragment &&
				 is_builtin_variable(var) && active_output_builtins.get(bi_type))
		{
			switch (bi_type)
			{
			case BuiltInSampleMask:
				if (has_additional_fixed_sample_mask())
				{
					// If the additional fixed sample mask was set, we need to adjust the sample_mask
					// output to reflect that. If the shader outputs the sample_mask itself too, we need
					// to AND the two masks to get the final one.
					string op_str = does_shader_write_sample_mask ? " &= " : " = ";
					entry_func.fixup_hooks_out.push_back([=]() {
						statement(to_expression(builtin_sample_mask_id), op_str, additional_fixed_sample_mask_str(), ";");
					});
				}
				break;
			case BuiltInFragDepth:
				if (msl_options.input_attachment_is_ds_attachment && !writes_to_depth)
				{
					entry_func.fixup_hooks_out.push_back([=]() {
						statement(to_expression(builtin_frag_depth_id), " = ", to_expression(builtin_frag_coord_id), ".z;");
					});
				}
				break;
			default:
				break;
			}
		}
	});
}